

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.c
# Opt level: O3

void litter(void)

{
  obj *poVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  obj *obj;
  
  obj = invent;
  iVar3 = weight_cap();
  if (obj != (obj *)0x0) {
    do {
      poVar1 = obj->nobj;
      if (obj != uball) {
        uVar4 = mt_random();
        if (SUB164(ZEXT416(uVar4) % SEXT816((long)iVar3),0) < (int)obj->owt) {
          bVar2 = canletgo(obj,"");
          if (bVar2 != '\0') {
            pcVar5 = aobjnam(obj,"follow");
            pline("Your %s you down the stairs.",pcVar5);
            dropx(obj);
          }
        }
      }
      obj = poVar1;
    } while (poVar1 != (obj *)0x0);
  }
  return;
}

Assistant:

static void litter(void)
{
	struct obj *otmp = invent, *nextobj;
	int capacity = weight_cap();

	while (otmp) {
		nextobj = otmp->nobj;
		if ((otmp != uball) && (rnd(capacity) <= (int)otmp->owt)) {
			if (canletgo(otmp, "")) {
				pline("Your %s you down the stairs.",
				     aobjnam(otmp, "follow"));
				dropx(otmp);
			}
		}
		otmp = nextobj;
	}
}